

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O0

bool GGWave_deinit(void)

{
  GGWave *pGVar1;
  undefined1 local_1;
  
  pGVar1 = (anonymous_namespace)::g_ggWave;
  if (((anonymous_namespace)::g_devIdInp == 0) && ((anonymous_namespace)::g_devIdOut == 0)) {
    local_1 = false;
  }
  else {
    if ((anonymous_namespace)::g_ggWave != (GGWave *)0x0) {
      GGWave::~GGWave((anonymous_namespace)::g_ggWave);
      operator_delete(pGVar1);
    }
    (anonymous_namespace)::g_ggWave = (GGWave *)0x0;
    SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,1);
    SDL_CloseAudioDevice((anonymous_namespace)::g_devIdInp);
    SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,1);
    SDL_CloseAudioDevice((anonymous_namespace)::g_devIdOut);
    (anonymous_namespace)::g_devIdInp = 0;
    (anonymous_namespace)::g_devIdOut = 0;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool GGWave_deinit() {
    if (g_devIdInp == 0 && g_devIdOut == 0) {
        return false;
    }

    delete g_ggWave;
    g_ggWave = nullptr;

    SDL_PauseAudioDevice(g_devIdInp, 1);
    SDL_CloseAudioDevice(g_devIdInp);
    SDL_PauseAudioDevice(g_devIdOut, 1);
    SDL_CloseAudioDevice(g_devIdOut);

    g_devIdInp = 0;
    g_devIdOut = 0;

    return true;
}